

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

int32_t u_parseString(char *s,UChar *dest,int32_t destCapacity,uint32_t *pFirst,
                     UErrorCode *pErrorCode)

{
  byte bVar1;
  uint uVar2;
  char *__nptr;
  ulong uVar3;
  int iVar4;
  int32_t iVar5;
  char *end;
  
  iVar5 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0 || s == (char *)0x0) || (dest == (UChar *)0x0 && destCapacity != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar5 = 0;
    }
    else {
      if (pFirst != (uint32_t *)0x0) {
        *pFirst = 0xffffffff;
      }
      iVar4 = 0;
      while( true ) {
        iVar5 = iVar4;
        __nptr = u_skipWhitespace(s);
        if ((*__nptr == ';') || (*__nptr == '\0')) break;
        uVar3 = strtoul(__nptr,&end,0x10);
        if (end <= __nptr) {
LAB_001f3abe:
          *pErrorCode = U_PARSE_ERROR;
          return 0;
        }
        bVar1 = *end;
        uVar2 = (uint)uVar3;
        if ((((0x3b < (ulong)bVar1) || ((0x800000100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
            (bVar1 != 0)) || (0x10ffff < uVar2)) goto LAB_001f3abe;
        if (pFirst != (uint *)0x0) {
          *pFirst = uVar2;
        }
        iVar4 = (iVar5 - (uint)(uVar2 < 0x10000)) + 2;
        pFirst = (uint *)0x0;
        s = end;
        if (iVar4 <= destCapacity) {
          if (uVar2 < 0x10000) {
            iVar4 = iVar5 + 1;
            dest[iVar5] = (UChar)uVar3;
          }
          else {
            dest[iVar5] = (short)(uVar3 >> 10) + L'ퟀ';
            iVar4 = iVar5 + 2;
            dest[(long)iVar5 + 1] = (UChar)uVar3 & 0x3ffU | 0xdc00;
          }
          pFirst = (uint *)0x0;
        }
      }
      if (iVar5 < destCapacity) {
        dest[iVar5] = L'\0';
      }
      else if (iVar5 == destCapacity) {
        *pErrorCode = U_STRING_NOT_TERMINATED_WARNING;
        iVar5 = destCapacity;
      }
      else {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
    }
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseString(const char *s,
              UChar *dest, int32_t destCapacity,
              uint32_t *pFirst,
              UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;
    int32_t destLength;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(pFirst!=NULL) {
        *pFirst=0xffffffff;
    }

    destLength=0;
    for(;;) {
        s=u_skipWhitespace(s);
        if(*s==';' || *s==0) {
            if(destLength<destCapacity) {
                dest[destLength]=0;
            } else if(destLength==destCapacity) {
                *pErrorCode=U_STRING_NOT_TERMINATED_WARNING;
            } else {
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            }
            return destLength;
        }

        /* read one code point */
        value=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || (!U_IS_INV_WHITESPACE(*end) && *end!=';' && *end!=0) || value>=0x110000) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }

        /* store the first code point */
        if(pFirst!=NULL) {
            *pFirst=value;
            pFirst=NULL;
        }

        /* append it to the destination array */
        if((destLength+U16_LENGTH(value))<=destCapacity) {
            U16_APPEND_UNSAFE(dest, destLength, value);
        } else {
            destLength+=U16_LENGTH(value);
        }

        /* go to the following characters */
        s=end;
    }
}